

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void term_pwron(Terminal *term,_Bool clear)

{
  power_on(term,clear);
  if (term->ldisc != (Ldisc *)0x0) {
    ldisc_echoedit_update(term->ldisc);
  }
  term->disptop = L'\0';
  term->selstate = LEXICOGRAPHIC;
  (term->selstart).y = L'\0';
  (term->selstart).x = L'\0';
  (term->selend).y = L'\0';
  (term->selend).x = L'\0';
  term_update(term);
  return;
}

Assistant:

void term_pwron(Terminal *term, bool clear)
{
    power_on(term, clear);
    if (term->ldisc)                   /* cause ldisc to notice changes */
        ldisc_echoedit_update(term->ldisc);
    term->disptop = 0;
    deselect(term);
    term_update(term);
}